

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

bool resize_buf_if_needed(char **__dest,size_t *__dest_size,size_t __n)

{
  ulong uVar1;
  char *pcVar2;
  vw_exception *this;
  string local_1d0;
  stringstream __msg;
  ostream local_1a0;
  
  uVar1 = *__dest_size;
  if (uVar1 < __n) {
    pcVar2 = (char *)realloc(*__dest,__n);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_1a0,"Can\'t realloc enough memory.");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x97,&local_1d0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    *__dest = pcVar2;
    *__dest_size = __n;
  }
  return uVar1 < __n;
}

Assistant:

bool resize_buf_if_needed(char*& __dest, size_t& __dest_size, const size_t __n)
{
  char* new_dest;
  if (__dest_size < __n)
  {
    if ((new_dest = (char*)realloc(__dest, __n)) == NULL)
      THROW("Can't realloc enough memory.")
    else
    {
      __dest = new_dest;
      __dest_size = __n;
      return true;
    }
  }
  return false;
}